

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::find
          (QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *this,int *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_> copy;
  iterator in_stack_ffffffffffffffb8;
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *in_stack_ffffffffffffffc0;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffffc0->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffffc0,
         (QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_stack_ffffffffffffffb8._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMap((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)0x8c41cd);
  }
  detach(in_stack_ffffffffffffffc0);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
                *)0x8c41e1);
  std::
  map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>
  ::find((map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>
          *)in_stack_ffffffffffffffb8._M_node,(key_type *)0x8c41f2);
  iterator::iterator((iterator *)0x8c4206,in_stack_ffffffffffffffb8);
  ~QMap((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)0x8c4210);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator find(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.find(key));
    }